

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darRefact.c
# Opt level: O2

void Dar_ManRefStop(Ref_Man_t *p)

{
  Vec_Vec_t *p_00;
  Vec_Int_t *__ptr;
  Vec_Ptr_t *p_01;
  int i;
  int i_00;
  
  if (p->pManDec != (Bdc_Man_t *)0x0) {
    Bdc_ManFree(p->pManDec);
  }
  if (p->pPars->fVerbose != 0) {
    Dar_ManRefPrintStats(p);
  }
  p_00 = p->vCuts;
  for (i_00 = 0; i_00 < p_00->nSize; i_00 = i_00 + 1) {
    p_01 = Vec_VecEntry(p_00,i_00);
    if (p_01 != (Vec_Ptr_t *)0x0) {
      Vec_PtrFree(p_01);
    }
  }
  Vec_PtrFree((Vec_Ptr_t *)p_00);
  Vec_PtrFree(p->vTruthElem);
  Vec_PtrFree(p->vTruthStore);
  Vec_PtrFree(p->vLeavesBest);
  __ptr = p->vMemory;
  free(__ptr->pArray);
  free(__ptr);
  Vec_PtrFree(p->vCutNodes);
  free(p);
  return;
}

Assistant:

void Dar_ManRefStop( Ref_Man_t * p )
{
    if ( p->pManDec )
        Bdc_ManFree( p->pManDec );
    if ( p->pPars->fVerbose )
        Dar_ManRefPrintStats( p );
    Vec_VecFree( p->vCuts );
    Vec_PtrFree( p->vTruthElem );
    Vec_PtrFree( p->vTruthStore );
    Vec_PtrFree( p->vLeavesBest );
    Vec_IntFree( p->vMemory );
    Vec_PtrFree( p->vCutNodes );
    ABC_FREE( p );
}